

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars,int nLevels)

{
  int iVar1;
  Vec_Mem_t *pVVar2;
  Vec_Int_t *pVVar3;
  int local_24;
  int i;
  Abc_TtHieMan_t *p;
  int nLevels_local;
  int nVars_local;
  
  if (nLevels < 6) {
    _nLevels_local = (Abc_TtHieMan_t *)calloc(1,0x78);
    _nLevels_local->nLastLevel = nLevels + -1;
    iVar1 = Abc_TtWordNum(nVars);
    _nLevels_local->nWords = iVar1;
    for (local_24 = 0; local_24 < nLevels; local_24 = local_24 + 1) {
      pVVar2 = Vec_MemAlloc(_nLevels_local->nWords,0xc);
      _nLevels_local->vTtMem[local_24] = pVVar2;
      Vec_MemHashAlloc(_nLevels_local->vTtMem[local_24],10000);
      pVVar3 = Vec_IntAlloc(1);
      _nLevels_local->vRepres[local_24] = pVVar3;
    }
    pVVar3 = Vec_IntAlloc(0x9c4);
    _nLevels_local->vPhase = pVVar3;
  }
  else {
    _nLevels_local = (Abc_TtHieMan_t *)0x0;
  }
  return _nLevels_local;
}

Assistant:

Abc_TtHieMan_t * Abc_TtHieManStart(int nVars, int nLevels)
{
    Abc_TtHieMan_t * p = NULL;
    int i;
    if (nLevels > TT_MAX_LEVELS) return p;
    p = ABC_CALLOC(Abc_TtHieMan_t, 1);
    p->nLastLevel = nLevels - 1;
    p->nWords = Abc_TtWordNum(nVars);
    for (i = 0; i < nLevels; i++)
    {
        p->vTtMem[i] = Vec_MemAlloc(p->nWords, 12);
        Vec_MemHashAlloc(p->vTtMem[i], 10000);
        p->vRepres[i] = Vec_IntAlloc(1);
    }
    p->vPhase = Vec_IntAlloc(2500);
    return p;
}